

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O3

int UpnpDiscovery_assign(UpnpDiscovery *p,UpnpDiscovery *q)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  sockaddr_storage *psVar12;
  sockaddr_storage *psVar13;
  byte bVar14;
  
  bVar14 = 0;
  iVar11 = 1;
  if (p != q) {
    iVar11 = q->m_Expires;
    p->m_ErrCode = q->m_ErrCode;
    p->m_Expires = iVar11;
    pcVar8 = UpnpString_get_String(q->m_DeviceID);
    iVar7 = UpnpString_set_String(p->m_DeviceID,pcVar8);
    iVar10 = 0;
    iVar11 = 0;
    if (iVar7 != 0) {
      pcVar8 = UpnpString_get_String(q->m_DeviceType);
      iVar7 = UpnpString_set_String(p->m_DeviceType,pcVar8);
      iVar11 = iVar10;
      if (iVar7 != 0) {
        pcVar8 = UpnpString_get_String(q->m_ServiceType);
        iVar7 = UpnpString_set_String(p->m_ServiceType,pcVar8);
        if (iVar7 != 0) {
          pcVar8 = UpnpString_get_String(q->m_ServiceVer);
          iVar7 = UpnpString_set_String(p->m_ServiceVer,pcVar8);
          if (iVar7 != 0) {
            pcVar8 = UpnpString_get_String(q->m_Location);
            iVar7 = UpnpString_set_String(p->m_Location,pcVar8);
            if (iVar7 != 0) {
              pcVar8 = UpnpString_get_String(q->m_Os);
              iVar7 = UpnpString_set_String(p->m_Os,pcVar8);
              if (iVar7 != 0) {
                pcVar8 = UpnpString_get_String(q->m_Date);
                iVar7 = UpnpString_set_String(p->m_Date,pcVar8);
                if (iVar7 != 0) {
                  pcVar8 = UpnpString_get_String(q->m_Ext);
                  iVar7 = UpnpString_set_String(p->m_Ext,pcVar8);
                  if (iVar7 != 0) {
                    psVar12 = &q->m_DestAddr;
                    psVar13 = &p->m_DestAddr;
                    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
                      cVar1 = psVar12->__ss_padding[0];
                      cVar2 = psVar12->__ss_padding[1];
                      cVar3 = psVar12->__ss_padding[2];
                      cVar4 = psVar12->__ss_padding[3];
                      cVar5 = psVar12->__ss_padding[4];
                      cVar6 = psVar12->__ss_padding[5];
                      psVar13->ss_family = psVar12->ss_family;
                      psVar13->__ss_padding[0] = cVar1;
                      psVar13->__ss_padding[1] = cVar2;
                      psVar13->__ss_padding[2] = cVar3;
                      psVar13->__ss_padding[3] = cVar4;
                      psVar13->__ss_padding[4] = cVar5;
                      psVar13->__ss_padding[5] = cVar6;
                      psVar12 = (sockaddr_storage *)((long)psVar12 + (ulong)bVar14 * -0x10 + 8);
                      psVar13 = (sockaddr_storage *)((long)psVar13 + (ulong)bVar14 * -0x10 + 8);
                    }
                    iVar11 = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar11;
}

Assistant:

int UpnpDiscovery_assign(UpnpDiscovery *p, const UpnpDiscovery *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpDiscovery_set_ErrCode(p, UpnpDiscovery_get_ErrCode(q));
		ok = ok &&
		     UpnpDiscovery_set_Expires(p, UpnpDiscovery_get_Expires(q));
		ok = ok && UpnpDiscovery_set_DeviceID(
				   p, UpnpDiscovery_get_DeviceID(q));
		ok = ok && UpnpDiscovery_set_DeviceType(
				   p, UpnpDiscovery_get_DeviceType(q));
		ok = ok && UpnpDiscovery_set_ServiceType(
				   p, UpnpDiscovery_get_ServiceType(q));
		ok = ok && UpnpDiscovery_set_ServiceVer(
				   p, UpnpDiscovery_get_ServiceVer(q));
		ok = ok && UpnpDiscovery_set_Location(
				   p, UpnpDiscovery_get_Location(q));
		ok = ok && UpnpDiscovery_set_Os(p, UpnpDiscovery_get_Os(q));
		ok = ok && UpnpDiscovery_set_Date(p, UpnpDiscovery_get_Date(q));
		ok = ok && UpnpDiscovery_set_Ext(p, UpnpDiscovery_get_Ext(q));
		ok = ok && UpnpDiscovery_set_DestAddr(
				   p, UpnpDiscovery_get_DestAddr(q));
	}

	return ok;
}